

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_file.c
# Opt level: O2

void file_glob_symbol(t_file_handle *x,t_symbol *spattern)

{
  char cVar1;
  char *filename;
  _outlet *x_00;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  t_symbol *s;
  int in_EDX;
  size_t i;
  ulong uVar8;
  t_atom outv [2];
  glob_t gg;
  stat_conflict sb;
  char pattern [1000];
  
  do_expandpath(spattern->s_name,pattern,in_EDX);
  sVar7 = strlen(pattern);
  cVar1 = pattern[sVar7 - 1];
  bVar3 = true;
  if (pattern._0_2_ != 0x2e) {
    iVar5 = bcmp("./",pattern,3);
    if (iVar5 != 0) {
      iVar5 = str_endswith(pattern,"/.");
      if (iVar5 == 0) {
        iVar5 = str_endswith(pattern,"/./");
        if (iVar5 == 0) {
          iVar5 = bcmp("..",pattern,3);
          if ((iVar5 != 0) && (pattern._0_4_ != 0x2f2e2e)) {
            iVar5 = str_endswith(pattern,"/..");
            if (iVar5 == 0) {
              iVar5 = str_endswith(pattern,"/../");
              if (iVar5 == 0) {
                bVar3 = false;
                goto LAB_00178cca;
              }
            }
          }
          bVar4 = true;
          bVar3 = false;
          goto LAB_00178cd1;
        }
      }
    }
  }
LAB_00178cca:
  bVar4 = false;
LAB_00178cd1:
  iVar5 = glob(pattern,0,(__errfunc *)0x0,(glob_t *)&gg);
  if (iVar5 == 0) {
    for (uVar8 = 0; uVar8 < gg.gl_pathc; uVar8 = uVar8 + 1) {
      filename = gg.gl_pathv[uVar8];
      iVar5 = do_file_stat((t_file_handle *)0x0,filename,&sb,(int *)0x0);
      bVar2 = (sb.st_mode & 0xf000) == 0x4000;
      if ((cVar1 != '/') || (bVar2 && iVar5 == 0)) {
        sVar7 = strlen(filename);
        iVar6 = (int)sVar7 + -1;
        if (filename[iVar6] == '/') {
          filename[iVar6] = '\0';
        }
        if (bVar3) {
LAB_00178db3:
          if (bVar4) {
LAB_00178de1:
            outv[0].a_w.w_symbol = gensym(filename);
            outv[0].a_type = A_SYMBOL;
            outv[1].a_w._0_4_ = (undefined4)(bVar2 && iVar5 == 0);
            outv[1].a_type = A_FLOAT;
            x_00 = x->x_dataout;
            s = gensym("list");
            outlet_list(x_00,s,2,outv);
          }
          else if (((*filename != '.') || (filename[1] != '.')) || (filename[2] != '\0')) {
            iVar6 = str_endswith(filename,"/..");
            if (iVar6 == 0) goto LAB_00178de1;
          }
        }
        else if ((*filename != '.') || (filename[1] != '\0')) {
          iVar6 = str_endswith(filename,"/.");
          if (iVar6 == 0) goto LAB_00178db3;
        }
      }
    }
  }
  else {
    outlet_bang(x->x_infoout);
  }
  globfree((glob_t *)&gg);
  return;
}

Assistant:

static void file_glob_symbol(t_file_handle*x, t_symbol*spattern) {
    t_atom outv[2];
    glob_t gg;
    int flags = 0;
    int matchdot=0;
    char pattern[MAXPDSTRING];
    size_t patternlen;
    int onlydirs;
    do_expandpath(spattern->s_name, pattern, MAXPDSTRING);
    patternlen=strlen(pattern);
    onlydirs = ('/' == pattern[patternlen-1]);
    if(!strcmp(".", pattern) || !strcmp("./", pattern)
        || str_endswith(pattern, "/.") || str_endswith(pattern, "/./"))
        matchdot=1;
    else if(!strcmp("..", pattern) || !strcmp("../", pattern)
        || str_endswith(pattern, "/..") || str_endswith(pattern, "/../"))
        matchdot=2;
    if(glob(pattern, flags, NULL, &gg)) {
            // this gets triggered if there is no match...
        outlet_bang(x->x_infoout);
    } else {
        size_t i;
        for(i=0; i<gg.gl_pathc; i++) {
            t_symbol *s;
            char*path = gg.gl_pathv[i];
            int isdir = 0;
            struct stat sb;
            int end;
            if(!do_file_stat(0, path, &sb, 0)) {
                isdir = S_ISDIR(sb.st_mode);
            }
            if(onlydirs && !isdir)
                continue;
            end=strlen(path);
            if('/' == path[end-1]) {
                path[end-1]=0;
            }
            if (matchdot!=1 && (!strcmp(path, ".") || str_endswith(path, "/.")))
                continue;
            if (matchdot!=2 && (!strcmp(path, "..") || str_endswith(path, "/..")))
                continue;

            s = gensym(path);
            SETSYMBOL(outv+0, s);
            SETFLOAT(outv+1, isdir);
            outlet_list(x->x_dataout, gensym("list"), 2, outv);
        }
    }
    globfree(&gg);
}